

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

BigInt * __thiscall BigInt::multiply(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  bool bVar1;
  uint uVar2;
  BigInt BStack_68;
  BigInt local_48;
  
  BigInt(&local_48,0);
  bVar1 = operator==(this,&local_48);
  if (bVar1) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  }
  else {
    BigInt(&BStack_68,0);
    bVar1 = operator==(b,&BStack_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&BStack_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
    if (!bVar1) {
      karatsuba(__return_storage_ptr__,this,this,b);
      get_real_length(__return_storage_ptr__);
      uVar2 = (uint)((b->sign == 0) != (this->sign == 0));
      __return_storage_ptr__->sign = uVar2;
      *(__return_storage_ptr__->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = uVar2;
      return __return_storage_ptr__;
    }
  }
  BigInt(__return_storage_ptr__,0);
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::multiply(BigInt& b) {
    if (*this == 0 || b == 0) {
        return BigInt(0);
    }
    BigInt temp = this->karatsuba(*this, b);
    temp.get_real_length();
    temp.set_sign(this->get_positive_sign() == b.get_positive_sign() ? true : false);
    return temp;
}